

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O0

size_t HUF_decompress1X2_usingDTable_internal
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int bmi2)

{
  size_t in_RCX;
  void *in_RDX;
  void *in_R8;
  int in_R9D;
  uint in_stack_ffffffffffffffc8;
  undefined8 local_8;
  
  if (in_R9D == 0) {
    local_8 = HUF_decompress1X2_usingDTable_internal_default
                        (in_RDX,in_RCX,in_R8,(ulong)in_stack_ffffffffffffffc8,(HUF_DTable *)0x3342dc
                        );
  }
  else {
    local_8 = HUF_decompress1X2_usingDTable_internal_bmi2
                        (in_RDX,in_RCX,in_R8,CONCAT44(in_R9D,in_stack_ffffffffffffffc8),
                         (HUF_DTable *)0x3342b7);
  }
  return local_8;
}

Assistant:

HUF_DGEN(HUF_decompress1X2_usingDTable_internal)
HUF_DGEN(HUF_decompress4X2_usingDTable_internal)

size_t HUF_decompress1X2_usingDTable(
          void* dst,  size_t dstSize,
    const void* cSrc, size_t cSrcSize,
    const HUF_DTable* DTable)
{
    DTableDesc dtd = HUF_getDTableDesc(DTable);
    if (dtd.tableType != 1) return ERROR(GENERIC);
    return HUF_decompress1X2_usingDTable_internal(dst, dstSize, cSrc, cSrcSize, DTable, /* bmi2 */ 0);
}